

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O0

void __thiscall trng::yarn2::split(yarn2 *this,uint s,uint n)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint in_EDX;
  uint in_ESI;
  int32_t (*in_RDI) [2];
  int32_t (*unaff_retaddr) [4];
  int i;
  int32_t b [4];
  int32_t a [2];
  int32_t q3;
  int32_t q2;
  int32_t q1;
  int32_t q0;
  invalid_argument *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar5;
  invalid_argument local_20 [20];
  int32_t (*paiVar6) [2];
  
  paiVar6 = in_RDI;
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    this_00 = local_20;
    std::invalid_argument::invalid_argument(this_00,"invalid argument for trng::yarn2::split");
    utility::throw_this<std::invalid_argument>(this_00);
    std::invalid_argument::~invalid_argument(local_20);
  }
  if (1 < in_ESI) {
    jump((yarn2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         (unsigned_long_long)in_RDI);
    iVar1 = in_RDI[1][0];
    jump((yarn2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         (unsigned_long_long)in_RDI);
    iVar2 = in_RDI[1][0];
    jump((yarn2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         (unsigned_long_long)in_RDI);
    iVar3 = in_RDI[1][0];
    jump((yarn2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         (unsigned_long_long)in_RDI);
    iVar4 = in_RDI[1][0];
    int_math::gauss<2>(unaff_retaddr,paiVar6,in_ESI);
    (*in_RDI)[0] = iVar3;
    (*in_RDI)[1] = iVar4;
    in_RDI[1][0] = iVar2;
    in_RDI[1][1] = iVar1;
    for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
      backward((yarn2 *)CONCAT44(iVar5,in_stack_ffffffffffffffa0));
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn2::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn2::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      int32_t a[2], b[4];
      a[0] = q2;
      b[0] = q1;
      b[1] = q0;
      a[1] = q3;
      b[2] = q2;
      b[3] = q1;
      int_math::gauss<2>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      S.r[0] = q1;
      S.r[1] = q0;
      for (int i{0}; i < 2; ++i)
        backward();
    }
  }